

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionPort::IfcDistributionPort(IfcDistributionPort *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcDistributionPort";
  IfcPort::IfcPort((IfcPort *)this,&PTR_construction_vtable_24__0081df20);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x81de18;
  *(undefined8 *)&this->field_0x148 = 0x81df08;
  *(undefined8 *)&this->field_0x88 = 0x81de40;
  *(undefined8 *)&this->field_0x98 = 0x81de68;
  *(undefined8 *)&this->field_0xd0 = 0x81de90;
  *(undefined8 *)&this->field_0x100 = 0x81deb8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x81dee0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20 = 0;
  this->field_0x140 = 0;
  return;
}

Assistant:

IfcDistributionPort() : Object("IfcDistributionPort") {}